

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cpp
# Opt level: O0

size_t __thiscall utf8_ptr::setwcharsz(utf8_ptr *this,wchar_t *src,size_t bufsiz)

{
  size_t sVar1;
  ulong in_RDX;
  wchar_t *in_RSI;
  utf8_ptr *in_RDI;
  size_t curbytes;
  size_t outbytes;
  wchar_t in_stack_ffffffffffffffcc;
  size_t local_20;
  ulong local_18;
  wchar_t *local_10;
  
  local_20 = 0;
  local_18 = in_RDX;
  for (local_10 = in_RSI; *local_10 != L'\0'; local_10 = local_10 + 1) {
    sVar1 = s_wchar_size(*local_10);
    local_20 = sVar1 + local_20;
    if (local_18 < sVar1) {
      local_18 = 0;
    }
    else {
      setch(in_RDI,in_stack_ffffffffffffffcc);
      local_18 = local_18 - local_20;
    }
  }
  return local_20;
}

Assistant:

size_t utf8_ptr::setwcharsz(const wchar_t *src, size_t bufsiz)
{
    /* loop through the source and store the characters */
    size_t outbytes;
    for (outbytes = 0 ; *src != 0 ; ++src)
    {
        /* figure out how many bytes we need for this character */
        size_t curbytes = s_wchar_size(*src);

        /* add it to the total output size */
        outbytes += curbytes;

        /* if we have room, add it to the buffer */
        if (bufsiz >= curbytes)
        {
            /* store it */
            setch(*src);

            /* deduct this space from the remaining buffer size */
            bufsiz -= outbytes;
        }
        else
        {
            /* 
             *   there's no room for this - make sure we don't store
             *   anything more (since we might have room for a shorter
             *   character later, but that would put a gap in the output
             *   string - better to just truncate here) 
             */
            bufsiz = 0;
        }
    }

    /* return the total output size used (or needed) */
    return outbytes;
}